

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ym2612_Emu.cpp
# Opt level: O1

void __thiscall Ym2612_Impl::run(Ym2612_Impl *this,int pair_count,sample_t_conflict1 *out)

{
  int *piVar1;
  uint uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int i;
  Ym2612_Impl *pYVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  undefined4 uVar13;
  channel_t *pcVar14;
  
  if (0 < pair_count) {
    if (((this->YM2612).Mode & 3) != 0) {
      run_timer(this,pair_count);
    }
    pcVar14 = (this->YM2612).CHANNEL;
    uVar2 = (this->YM2612).Mode;
    lVar8 = 0;
    pYVar9 = this;
    do {
      if ((this->YM2612).CHANNEL[lVar8].SLOT[0].Finc == -1) {
        uVar10 = 0;
        if (lVar8 == 2) {
          uVar10 = uVar2 >> 5 & 2;
        }
        lVar11 = 0xf4;
        do {
          iVar12 = pcVar14[lVar8].KC[(int)uVar10] >>
                   (*(byte *)((long)pYVar9 + lVar11 + -0x5c) & 0x1f);
          *(uint *)((long)(pYVar9->YM2612).CHANNEL[0].S0_OUT + lVar11 + -0x48) =
               (((this->g).FINC_TAB[pcVar14[lVar8].FNUM[(int)uVar10]] >>
                (7U - (char)pcVar14[lVar8].FOCT[(int)uVar10] & 0x1f)) +
               *(int *)(*(long *)((long)pYVar9 + lVar11 + -0x74) +
                       (long)pcVar14[lVar8].KC[(int)uVar10] * 4)) *
               *(int *)((long)pYVar9 + lVar11 + -0x6c);
          if (*(int *)((long)(pYVar9->YM2612).CHANNEL[0].S0_OUT + lVar11 + -0x80) != iVar12) {
            *(int *)((long)(pYVar9->YM2612).CHANNEL[0].S0_OUT + lVar11 + -0x80) = iVar12;
            lVar7 = (long)iVar12;
            lVar6 = *(long *)((long)(pYVar9->YM2612).CHANNEL[0].S0_OUT + lVar11 + -100);
            uVar13 = *(undefined4 *)
                      (*(long *)((long)(pYVar9->YM2612).CHANNEL[0].S0_OUT + lVar11 + -0x6c) +
                      lVar7 * 4);
            *(undefined4 *)((long)(pYVar9->YM2612).CHANNEL[0].S0_OUT + lVar11 + -0x34) = uVar13;
            uVar3 = *(undefined4 *)(lVar6 + lVar7 * 4);
            *(undefined4 *)((long)(pYVar9->YM2612).CHANNEL[0].S0_OUT + lVar11 + -0x30) = uVar3;
            uVar4 = *(undefined4 *)
                     (*(long *)((long)(pYVar9->YM2612).CHANNEL[0].S0_OUT + lVar11 + -0x5c) +
                     lVar7 * 4);
            *(undefined4 *)((long)(pYVar9->YM2612).CHANNEL[0].S0_OUT + lVar11 + -0x2c) = uVar4;
            uVar5 = *(undefined4 *)
                     (*(long *)((long)(pYVar9->YM2612).CHANNEL[0].S0_OUT + lVar11 + -0x54) +
                     lVar7 * 4);
            *(undefined4 *)((long)(pYVar9->YM2612).CHANNEL[0].S0_OUT + lVar11 + -0x28) = uVar5;
            iVar12 = *(int *)((long)(pYVar9->YM2612).CHANNEL[0].S0_OUT + lVar11 + -0x44);
            if (((iVar12 == 0) || (uVar13 = uVar3, iVar12 == 1)) ||
               ((*(int *)((long)(pYVar9->YM2612).CHANNEL[0].S0_OUT + lVar11 + -0x40) < 0x20000000 &&
                ((uVar13 = uVar4, iVar12 == 2 || (uVar13 = uVar5, iVar12 == 3)))))) {
              *(undefined4 *)((long)(pYVar9->YM2612).CHANNEL[0].S0_OUT + lVar11 + -0x3c) = uVar13;
            }
          }
          if (uVar10 != 0) {
            uVar10 = (int)uVar10 >> 1 ^ uVar10 ^ 2;
          }
          lVar11 = lVar11 + 0x90;
        } while (lVar11 != 0x334);
      }
      lVar8 = lVar8 + 1;
      pYVar9 = (Ym2612_Impl *)&(pYVar9->YM2612).CHANNEL[0].SLOT[3].EincS;
    } while (lVar8 != 6);
    lVar8 = 0;
    do {
      if ((((uint)this->mute_mask >> ((uint)lVar8 & 0x1f) & 1) == 0) &&
         ((lVar8 != 5 || ((this->YM2612).DAC == 0)))) {
        (*UPDATE_CHAN[pcVar14->ALGO])(&this->g,pcVar14,out,pair_count);
      }
      lVar8 = lVar8 + 1;
      pcVar14 = pcVar14 + 1;
    } while (lVar8 != 6);
    piVar1 = &(this->g).LFOcnt;
    *piVar1 = *piVar1 + pair_count * (this->g).LFOinc;
  }
  return;
}

Assistant:

void Ym2612_Impl::run( int pair_count, Ym2612_Emu::sample_t* out )
{
	if ( pair_count <= 0 )
		return;
	
	if ( YM2612.Mode & 3 )
		run_timer( pair_count );
	
	// Mise �Ejour des pas des compteurs-frequences s'ils ont ete modifies
	
	for ( int chi = 0; chi < channel_count; chi++ )
	{
		channel_t& ch = YM2612.CHANNEL [chi];
		if ( ch.SLOT [0].Finc != -1 )
			continue;
		
		int i2 = 0;
		if ( chi == 2 && (YM2612.Mode & 0x40) )
			i2 = 2;
		
		for ( int i = 0; i < 4; i++ )
		{
			// static int seq [4] = { 2, 1, 3, 0 };
			// if ( i2 ) i2 = seq [i];
			
			slot_t& sl = ch.SLOT [i];
			int finc = g.FINC_TAB [ch.FNUM [i2]] >> (7 - ch.FOCT [i2]);
			int ksr = ch.KC [i2] >> sl.KSR_S;   // keycode attenuation
			sl.Finc = (finc + sl.DT [ch.KC [i2]]) * sl.MUL;
			if (sl.KSR != ksr)          // si le KSR a change alors
			{                       // les differents taux pour l'enveloppe sont mis �Ejour
				sl.KSR = ksr;

				sl.EincA = sl.AR [ksr];
				sl.EincD = sl.DR [ksr];
				sl.EincS = sl.SR [ksr];
				sl.EincR = sl.RR [ksr];

				if (sl.Ecurp == ATTACK)
				{
					sl.Einc = sl.EincA;
				}
				else if (sl.Ecurp == DECAY)
				{
					sl.Einc = sl.EincD;
				}
				else if (sl.Ecnt < ENV_END)
				{
					if (sl.Ecurp == SUBSTAIN)
						sl.Einc = sl.EincS;
					else if (sl.Ecurp == RELEASE)
						sl.Einc = sl.EincR;
				}
			}
			
			if ( i2 )
				i2 = (i2 ^ 2) ^ (i2 >> 1);
		}
	}
	
	for ( int i = 0; i < channel_count; i++ )
	{
		if ( !(mute_mask & (1 << i)) && (i != 5 || !YM2612.DAC) )
			UPDATE_CHAN [YM2612.CHANNEL [i].ALGO]( g, YM2612.CHANNEL [i], out, pair_count );
	}
	
	g.LFOcnt += g.LFOinc * pair_count;
}